

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O2

bool __thiscall cmParsePHPCoverage::ReadPHPCoverageDirectory(cmParsePHPCoverage *this,char *d)

{
  bool bVar1;
  unsigned_long uVar2;
  char *__s;
  uint uVar3;
  Directory dir;
  string file;
  string path;
  allocator<char> local_89;
  Directory local_88;
  cmParsePHPCoverage *local_80;
  char *local_78;
  string local_70;
  char *local_50 [4];
  
  local_80 = this;
  cmsys::Directory::Directory(&local_88);
  local_78 = d;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,d,(allocator<char> *)local_50);
  bVar1 = cmsys::Directory::Load(&local_88,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    uVar2 = cmsys::Directory::GetNumberOfFiles(&local_88);
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      __s = cmsys::Directory::GetFile(&local_88,(ulong)uVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,__s,(allocator<char> *)local_50);
      bVar1 = std::operator!=(&local_70,".");
      if (bVar1) {
        bVar1 = std::operator!=(&local_70,"..");
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_70);
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_50,local_78,&local_89);
            std::__cxx11::string::append((char *)local_50);
            std::__cxx11::string::append((string *)local_50);
            bVar1 = ReadPHPData(local_80,local_50[0]);
            std::__cxx11::string::~string((string *)local_50);
            if (!bVar1) {
              std::__cxx11::string::~string((string *)&local_70);
              goto LAB_00170d25;
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
    bVar1 = true;
  }
  else {
LAB_00170d25:
    bVar1 = false;
  }
  cmsys::Directory::~Directory(&local_88);
  return bVar1;
}

Assistant:

bool cmParsePHPCoverage::ReadPHPCoverageDirectory(const char* d)
{
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = d;
      path += "/";
      path += file;
      if (!this->ReadPHPData(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}